

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O0

bool __thiscall
density::detail::
LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
::Consume::advance_head(Consume *this)

{
  ControlBlock *pCVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  void *i_second;
  undefined8 *puVar5;
  ControlBlock *pCVar6;
  uintptr_t __n;
  uintptr_t memset_size;
  uintptr_t *memset_dest;
  bool is_same_page;
  ExternalBlock *external_block;
  atomic<density::detail::LfQueueControl_*> next;
  Consume *this_local;
  
  i_second = (void *)(*(ulong *)(this + 0x10) & 0xfffffffffffffff0);
  if (*(long *)(*(long *)this + 0x80) == *(long *)(this + 8)) {
    *(void **)(*(long *)this + 0x80) = i_second;
    if ((*(ulong *)(this + 0x10) & 4) != 0) {
      puVar5 = (undefined8 *)address_add(*(void **)(this + 8),0x10);
      density_tests::UnmovableFastTestAllocator<256UL>::deallocate
                (*(UnmovableFastTestAllocator<256UL> **)this,(void *)*puVar5,puVar5[1],puVar5[2],0);
    }
    bVar3 = LFQueue_Base<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
            ::same_page(*(void **)(this + 8),i_second);
    bVar4 = address_is_aligned(i_second,0x100);
    if (bVar3 == bVar4) {
      density_tests::detail::assert_failed<>
                ("is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
                 ,0x119);
    }
    bVar4 = ConstConditional(true);
    if ((bVar4) &&
       (pCVar1 = *(ControlBlock **)(this + 8),
       pCVar6 = LFQueue_Base<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
                ::get_end_control_block(*(void **)(this + 8)), bVar3 != (pCVar1 != pCVar6))) {
      density_tests::detail::assert_failed<>
                ("!ConstConditional(Base::s_needs_end_control) || is_same_page == (m_control != Base::get_end_control_block(m_control))"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
                 ,0x11c);
    }
    raw_atomic_store(*(uintptr_t **)(this + 8),0,memory_order_seq_cst);
    if (bVar3) {
      lVar2 = *(long *)(this + 8);
      __n = address_diff(i_second,(void *)(lVar2 + 8));
      memset((void *)(lVar2 + 8),0,__n);
    }
    else {
      density_tests::UnmovableFastTestAllocator<256UL>::deallocate_page_zeroed
                (*(UnmovableFastTestAllocator<256UL> **)this,*(void **)(this + 8));
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool advance_head()
                {
                    auto next = reinterpret_cast<ControlBlock *>(m_next_ptr & ~LfQueue_AllFlags);

                    if (m_queue->m_head == m_control)
                    {
                        m_queue->m_head = next;
                        if (m_next_ptr & LfQueue_External)
                        {
                            auto const external_block = static_cast<ExternalBlock *>(
                              address_add(m_control, Base::s_element_min_offset));
                            m_queue->ALLOCATOR_TYPE::deallocate(
                              external_block->m_block,
                              external_block->m_size,
                              external_block->m_alignment);
                        }

                        bool const is_same_page = Base::same_page(m_control, next);
                        DENSITY_ASSERT_INTERNAL(
                          is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment));
                        DENSITY_ASSERT_INTERNAL(
                          !ConstConditional(Base::s_needs_end_control) ||
                          is_same_page == (m_control != Base::get_end_control_block(m_control)));

                        static_assert(offsetof(ControlBlock, m_next) == 0, "");

                        if (Base::s_deallocate_zeroed_pages)
                        {
                            raw_atomic_store(&m_control->m_next, uintptr_t(0));
                        }

                        if (is_same_page)
                        {
                            if (Base::s_deallocate_zeroed_pages)
                            {
                                auto const memset_dest =
                                  const_cast<uintptr_t *>(&m_control->m_next) + 1;
                                auto const memset_size = address_diff(next, memset_dest);
                                DENSITY_ASSUME_ALIGNED(memset_dest, alignof(uintptr_t));
                                DENSITY_ASSUME_UINT_ALIGNED(memset_size, alignof(uintptr_t));
                                std::memset(memset_dest, 0, memset_size);
                            }
                        }
                        else
                        {
                            if (Base::s_deallocate_zeroed_pages)
                                m_queue->ALLOCATOR_TYPE::deallocate_page_zeroed(m_control);
                            else
                                m_queue->ALLOCATOR_TYPE::deallocate_page(m_control);
                        }
                        return true;
                    }
                    else
                    {
                        return false;
                    }
                }